

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O0

void __thiscall
test::iu_AssertionTest_x_iutest_x_GE_Test::iu_AssertionTest_x_iutest_x_GE_Test
          (iu_AssertionTest_x_iutest_x_GE_Test *this)

{
  iu_AssertionTest_x_iutest_x_GE_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__iu_AssertionTest_x_iutest_x_GE_Test_0061d0b8;
  return;
}

Assistant:

IUTEST(AssertionTest, GE)
{
    int x0=0, y0=0;
    float f0=0.0f, f1=1.0f;
    double d0=0.0, d1=1.0;
    IUTEST_ASSERT_GE(x0, y0);
    IUTEST_EXPECT_GE(f1, f0);
    IUTEST_INFORM_GE(0x1, 0.0f);
    IUTEST_INFORM_GE(d1, d0);
}